

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp.cpp
# Opt level: O0

bool send_update_with_nlri(bgp_peer *peer,attributes *attr,uint32_t prefix,uint8_t prefix_len)

{
  uint16_t __hostshort;
  int iVar1;
  size_t sVar2;
  undefined8 local_433;
  bgp_header header;
  size_t attr_size_ordered;
  size_t attr_size;
  undefined8 uStack_408;
  uint16_t pointer;
  uchar buffer [1000];
  uint8_t prefix_len_local;
  uint32_t prefix_local;
  attributes *attr_local;
  bgp_peer *peer_local;
  
  buffer[0x3e3] = prefix_len;
  buffer._996_4_ = prefix;
  memset(&stack0xfffffffffffffbf8,0,1000);
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  sVar2 = encode_bgp_path_attributes_to_buffer(peer,attr,(uchar *)&stack0xfffffffffffffbf8,0x17);
  __hostshort = (uint16_t)sVar2;
  buffer._13_2_ = htons(__hostshort);
  header._11_8_ = ZEXT28((ushort)buffer._13_2_);
  attr_size._6_2_ = __hostshort + 0x18;
  buffer[(ulong)(ushort)(__hostshort + 0x17) - 8] = buffer[0x3e3];
  if (buffer[0x3e3] < 9) {
    buffer[(ulong)attr_size._6_2_ - 8] = buffer[0x3e4];
    attr_size._6_2_ = __hostshort + 0x19;
  }
  else if (buffer[0x3e3] < 0x11) {
    *(undefined2 *)(buffer + ((ulong)attr_size._6_2_ - 8)) = buffer._996_2_;
    attr_size._6_2_ = __hostshort + 0x1a;
  }
  else if (buffer[0x3e3] < 0x19) {
    *(undefined2 *)(buffer + ((ulong)attr_size._6_2_ - 8)) = buffer._996_2_;
    buffer[(ulong)attr_size._6_2_ - 6] = buffer[0x3e6];
    attr_size._6_2_ = __hostshort + 0x1b;
  }
  else if (buffer[0x3e3] < 0x21) {
    *(undefined4 *)(buffer + ((ulong)attr_size._6_2_ - 8)) = buffer._996_4_;
    attr_size._6_2_ = __hostshort + 0x1c;
  }
  memset(&local_433,0xff,0x10);
  header.maker[10] = '\x02';
  header.maker._8_2_ = htons(attr_size._6_2_);
  uStack_408 = local_433;
  buffer[0] = header.maker[0];
  buffer[1] = header.maker[1];
  buffer[2] = header.maker[2];
  buffer[3] = header.maker[3];
  buffer[4] = header.maker[4];
  buffer[5] = header.maker[5];
  buffer[6] = header.maker[6];
  buffer[7] = header.maker[7];
  buffer[10] = header.maker[10];
  buffer._8_2_ = header.maker._8_2_;
  iVar1 = (**peer->_vptr_bgp_peer)(peer,&stack0xfffffffffffffbf8,(ulong)attr_size._6_2_);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool send_update_with_nlri(bgp_peer* peer, attributes* attr, uint32_t prefix, uint8_t prefix_len){
    unsigned char buffer[1000];
    memset(buffer, 0, 1000);
    uint16_t pointer = BGP_HEADER_SIZE;

    buffer[pointer++] = 0; // withdraw routes length (2byte)
    buffer[pointer++] = 0;

    pointer += 2;
    size_t attr_size = encode_bgp_path_attributes_to_buffer(peer, attr, buffer, pointer);
    size_t attr_size_ordered = htons(attr_size);
    memcpy(&buffer[pointer-2], &attr_size_ordered, 2);
    pointer += attr_size;

    buffer[pointer++] = prefix_len;
    if(prefix_len <= 8){
        memcpy(&buffer[pointer], &prefix, 1);
        pointer += 1;
    }else if(prefix_len <= 16){
        memcpy(&buffer[pointer], &prefix, 2);
        pointer += 2;
    }else if(prefix_len <= 24){
        memcpy(&buffer[pointer], &prefix, 3);
        pointer += 3;
    }else if(prefix_len <= 32){
        memcpy(&buffer[pointer], &prefix, 4);
        pointer += 4;
    }

    bgp_header header;
    memset(header.maker, 0xff, 16);
    header.type = UPDATE;
    header.length = htons(pointer);
    memcpy(&buffer[0], &header, BGP_HEADER_SIZE);
    //hex_dump(buffer, pointer);
    return peer->send(buffer, pointer);
}